

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool __thiscall sf::Shader::loadFromStream(Shader *this,InputStream *stream,Type type)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> shader;
  Type type_local;
  InputStream *stream_local;
  Shader *this_local;
  
  shader.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = type;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_40);
  bVar1 = anon_unknown.dwarf_ca316::getStreamContents
                    (stream,(vector<char,_std::allocator<char>_> *)local_40);
  if (bVar1) {
    if (shader.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0) {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_40,0);
      this_local._7_1_ = compile(this,pvVar3,(char *)0x0,(char *)0x0);
    }
    else if (shader.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 1) {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_40,0);
      this_local._7_1_ = compile(this,(char *)0x0,pvVar3,(char *)0x0);
    }
    else {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_40,0);
      this_local._7_1_ = compile(this,(char *)0x0,(char *)0x0,pvVar3);
    }
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to read shader from stream");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return this_local._7_1_;
}

Assistant:

bool Shader::loadFromStream(InputStream& stream, Type type)
{
    // Read the shader code from the stream
    std::vector<char> shader;
    if (!getStreamContents(stream, shader))
    {
        err() << "Failed to read shader from stream" << std::endl;
        return false;
    }

    // Compile the shader program
    if (type == Vertex)
        return compile(&shader[0], NULL, NULL);
    else if (type == Geometry)
        return compile(NULL, &shader[0], NULL);
    else
        return compile(NULL, NULL, &shader[0]);
}